

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# driver_discovery_lin.cpp
# Opt level: O2

vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
* loader::discoverEnabledDrivers_abi_cxx11_(void)

{
  char *pcVar1;
  vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *in_RDI;
  long lVar2;
  allocator local_1d1;
  string substr;
  stringstream ss;
  int aiStack_190 [90];
  
  *(undefined8 *)in_RDI = 0;
  *(undefined8 *)(in_RDI + 8) = 0;
  *(undefined8 *)(in_RDI + 0x10) = 0;
  pcVar1 = getenv("ZE_ENABLE_ALT_DRIVERS");
  if (pcVar1 == (char *)0x0) {
    for (lVar2 = 0; lVar2 != 0x20; lVar2 = lVar2 + 8) {
      _ss = *(undefined8 *)((long)&knownDriverNames + lVar2);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<char_const*&>(in_RDI,(char **)&ss);
    }
  }
  else {
    std::__cxx11::string::string((string *)&substr,pcVar1,&local_1d1);
    std::__cxx11::stringstream::stringstream((stringstream *)&ss,(string *)&substr,_S_out|_S_in);
    std::__cxx11::string::~string((string *)&substr);
    while (*(int *)((long)aiStack_190 + *(long *)(_ss + -0x18)) == 0) {
      substr._M_string_length = 0;
      substr.field_2._M_local_buf[0] = '\0';
      substr._M_dataplus._M_p = (pointer)&substr.field_2;
      std::getline<char,std::char_traits<char>,std::allocator<char>>
                ((istream *)&ss,(string *)&substr,',');
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string&>(in_RDI,&substr);
      std::__cxx11::string::~string((string *)&substr);
    }
    std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
  }
  return (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)in_RDI;
}

Assistant:

std::vector<DriverLibraryPath> discoverEnabledDrivers() {
  std::vector<DriverLibraryPath> enabledDrivers;
  const char *altDrivers = nullptr;

  // ZE_ENABLE_ALT_DRIVERS is for development/debug only
  altDrivers = getenv("ZE_ENABLE_ALT_DRIVERS");
  if (altDrivers == nullptr) {
    for (auto path : knownDriverNames) {
      enabledDrivers.emplace_back(path);
    }
  } else {
    std::stringstream ss(altDrivers);
    while (ss.good()) {
      std::string substr;
      getline(ss, substr, ',');
      enabledDrivers.emplace_back(substr);
    }
  }
  return enabledDrivers;
}